

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::end_object(generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
             *this)

{
  bool bVar1;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *this_00;
  error_code eVar2;
  unique_ptr<pstore::repo::generic_section_creation_dispatcher,_std::default_delete<pstore::repo::generic_section_creation_dispatcher>_>
  local_50;
  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  local_48;
  undefined4 local_3c;
  undefined1 local_38 [8];
  error_or<pstore::repo::section_content_*> c;
  generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *this_local;
  error_category *local_10;
  
  c._16_8_ = this;
  content_object((error_or<pstore::repo::section_content_*> *)local_38,this);
  bVar1 = error_or::operator_cast_to_bool((error_or *)local_38);
  if (bVar1) {
    error_or<pstore::repo::section_content_*>::get
              ((error_or<pstore::repo::section_content_*> *)local_38);
    std::
    make_unique<pstore::repo::generic_section_creation_dispatcher,pstore::repo::section_kind_const&,pstore::repo::section_content*const&>
              ((section_kind *)&local_50,(section_content **)&this->kind_);
    std::
    unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>
    ::
    unique_ptr<pstore::repo::generic_section_creation_dispatcher,std::default_delete<pstore::repo::generic_section_creation_dispatcher>,void>
              ((unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>
                *)&local_48,&local_50);
    this_00 = gsl::not_null::operator_cast_to_back_insert_iterator_((not_null *)&this->out_);
    std::
    back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
    ::operator=(this_00,(value_type *)&local_48);
    std::
    unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    ::~unique_ptr(&local_48);
    std::
    unique_ptr<pstore::repo::generic_section_creation_dispatcher,_std::default_delete<pstore::repo::generic_section_creation_dispatcher>_>
    ::~unique_ptr(&local_50);
    eVar2 = rule::pop(&this->super_rule);
    local_10 = eVar2._M_cat;
    this_local._0_4_ = eVar2._M_value;
  }
  else {
    eVar2 = error_or<pstore::repo::section_content_*>::get_error
                      ((error_or<pstore::repo::section_content_*> *)local_38);
    local_10 = eVar2._M_cat;
    this_local._0_4_ = eVar2._M_value;
  }
  local_3c = 1;
  error_or<pstore::repo::section_content_*>::~error_or
            ((error_or<pstore::repo::section_content_*> *)local_38);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code generic_section<OutputIterator>::end_object () {
                error_or<repo::section_content *> const c = this->content_object ();
                if (!c) {
                    return c.get_error ();
                }
                *out_ = std::make_unique<
                    repo::section_to_creation_dispatcher<repo::generic_section>::type> (kind_,
                                                                                        c.get ());
                return pop ();
            }